

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

void copy_and_extend_plane
               (uint8_t *src,int src_pitch,uint8_t *dst,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right,int chroma_step)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  int in_R8D;
  int in_R9D;
  int j;
  uint8_t *dst_ptr2;
  uint8_t *dst_ptr1;
  uint8_t *src_ptr2;
  uint8_t *src_ptr1;
  int in_stack_00000028;
  int linesize;
  int i;
  int local_54;
  void *local_50;
  void *local_48;
  byte *local_40;
  byte *local_38;
  int local_28;
  
  local_40 = in_RDI + (in_R8D + -1) * in_stack_00000028;
  local_48 = (void *)(in_RDX - (int)dst_ptr1);
  local_50 = (void *)(in_RDX + in_R8D);
  local_38 = in_RDI;
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    memset(local_48,(uint)*local_38,(long)(int)dst_ptr1);
    if (in_stack_00000028 == 1) {
      memcpy((void *)((long)local_48 + (long)(int)dst_ptr1),local_38,(long)in_R8D);
    }
    else {
      for (local_54 = 0; local_54 < in_R8D; local_54 = local_54 + 1) {
        *(byte *)((long)local_48 + (long)((int)dst_ptr1 + local_54)) =
             local_38[in_stack_00000028 * local_54];
      }
    }
    memset(local_50,(uint)*local_40,(long)(int)src_ptr1);
    local_38 = local_38 + in_ESI;
    local_40 = local_40 + in_ESI;
    local_48 = (void *)((long)local_48 + (long)in_ECX);
    local_50 = (void *)((long)local_50 + (long)in_ECX);
  }
  local_48 = (void *)((in_RDX + in_ECX * -(int)dst_ptr2) - (long)(int)dst_ptr1);
  local_50 = (void *)((in_RDX + in_ECX * in_R9D) - (long)(int)dst_ptr1);
  iVar1 = (int)dst_ptr1 + (int)src_ptr1 + in_R8D;
  for (local_28 = 0; local_28 < (int)dst_ptr2; local_28 = local_28 + 1) {
    memcpy(local_48,(void *)(in_RDX - (int)dst_ptr1),(long)iVar1);
    local_48 = (void *)((long)local_48 + (long)in_ECX);
  }
  for (local_28 = 0; local_28 < (int)src_ptr2; local_28 = local_28 + 1) {
    memcpy(local_50,(void *)((in_RDX + in_ECX * (in_R9D + -1)) - (long)(int)dst_ptr1),(long)iVar1);
    local_50 = (void *)((long)local_50 + (long)in_ECX);
  }
  return;
}

Assistant:

static void copy_and_extend_plane(const uint8_t *src, int src_pitch,
                                  uint8_t *dst, int dst_pitch, int w, int h,
                                  int extend_top, int extend_left,
                                  int extend_bottom, int extend_right,
                                  int chroma_step) {
  int i, linesize;
  // copy the left and right most columns out
  const uint8_t *src_ptr1 = src;
  const uint8_t *src_ptr2 = src + (w - 1) * chroma_step;
  uint8_t *dst_ptr1 = dst - extend_left;
  uint8_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    if (chroma_step == 1) {
      memcpy(dst_ptr1 + extend_left, src_ptr1, w);
    } else {
      for (int j = 0; j < w; j++) {
        dst_ptr1[extend_left + j] = src_ptr1[chroma_step * j];
      }
    }
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize);
    dst_ptr2 += dst_pitch;
  }
}